

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O0

Point * MeshLib::Trait::getUV(Point *__return_storage_ptr__,string *s)

{
  undefined8 uVar1;
  undefined1 local_458 [8];
  char line [1024];
  double local_50;
  double py;
  double px;
  string subs;
  size_type pos;
  string *s_local;
  
  subs.field_2._8_8_ = std::__cxx11::string::find((char *)s,0x1338a9);
  std::__cxx11::string::substr((ulong)&px,(ulong)s);
  uVar1 = std::__cxx11::string::c_str();
  __isoc99_sscanf(uVar1,"uv=(%lf %lf)%s",&py,&local_50,local_458);
  Point::Point(__return_storage_ptr__,py,local_50,0.0);
  std::__cxx11::string::~string((string *)&px);
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getUV(std::string s)
{
	std::string::size_type pos = s.find ("uv=");
	std::string subs = s.substr (pos);
	double px, py;
	char line[1024];
	sscanf(subs.c_str (),"uv=(%lf %lf)%s",&px,&py,line);
	return Point(px,py,0);
}